

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::isValidRegistryBasedAuthority(XMLCh *authority,XMLSize_t authLen)

{
  XMLCh theChar;
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = authLen == 0;
  if (!bVar5) {
    uVar4 = 0;
    do {
      theChar = authority[uVar4];
      bVar1 = XMLString::isAlphaNum(theChar);
      lVar3 = 1;
      if (((!bVar1) && (iVar2 = XMLString::indexOf((XMLCh *)MARK_CHARACTERS,theChar), iVar2 == -1))
         && (iVar2 = XMLString::indexOf((XMLCh *)REG_NAME_CHARACTERS,authority[uVar4]), iVar2 == -1)
         ) {
        if (authority[uVar4] != L'%') {
          return bVar5;
        }
        if (authLen <= uVar4 + 2) {
          return bVar5;
        }
        bVar1 = XMLString::isHex(authority[uVar4 + 1]);
        if (!bVar1) {
          return bVar5;
        }
        bVar1 = XMLString::isHex(authority[uVar4 + 2]);
        lVar3 = 3;
        if (!bVar1) {
          return bVar5;
        }
      }
      uVar4 = uVar4 + lVar3;
      bVar5 = uVar4 >= authLen;
    } while (uVar4 < authLen);
  }
  return bVar5;
}

Assistant:

bool XMLUri::isValidRegistryBasedAuthority(const XMLCh* const authority,
                                           const XMLSize_t authLen)
{
    // check authority
    XMLSize_t index = 0;
    while (index < authLen)
    {
        if (isUnreservedCharacter(authority[index]) ||
            (XMLString::indexOf(REG_NAME_CHARACTERS, authority[index]) != -1))
        {
            index++;
        }
        else if (authority[index] == chPercent)               // '%'
        {
            if (index + 2 < authLen
                && XMLString::isHex(authority[index+1])       // 1st hex
                && XMLString::isHex(authority[index+2])  )    // 2nd hex
                index +=3;
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}